

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_do(connectdata *conn,_Bool *done)

{
  CURLcode result;
  _Bool *done_local;
  connectdata *conn_local;
  
  *done = false;
  conn_local._4_4_ = pop3_parse_url_path(conn);
  if ((conn_local._4_4_ == CURLE_OK) &&
     (conn_local._4_4_ = pop3_parse_custom_request(conn), conn_local._4_4_ == CURLE_OK)) {
    conn_local._4_4_ = pop3_regular_transfer(conn,done);
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode pop3_do(struct connectdata *conn, bool *done)
{
  CURLcode result = CURLE_OK;

  *done = FALSE; /* default to false */

  /* Parse the URL path */
  result = pop3_parse_url_path(conn);
  if(result)
    return result;

  /* Parse the custom request */
  result = pop3_parse_custom_request(conn);
  if(result)
    return result;

  result = pop3_regular_transfer(conn, done);

  return result;
}